

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::AppendNoCheck(SnappyIOVecWriter *this,char *ip,size_t len)

{
  size_t __n;
  unsigned_long *puVar1;
  unsigned_long in_RDX;
  void *in_RSI;
  ulong *in_RDI;
  size_t to_write;
  unsigned_long local_20;
  void *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  do {
    if (local_20 == 0) {
      return true;
    }
    if (in_RDI[3] == 0) {
      if (*in_RDI <= in_RDI[1] + 0x10) {
        return false;
      }
      in_RDI[1] = in_RDI[1] + 0x10;
      in_RDI[2] = *(ulong *)in_RDI[1];
      in_RDI[3] = *(ulong *)(in_RDI[1] + 8);
    }
    puVar1 = std::min<unsigned_long>(&local_20,in_RDI + 3);
    __n = *puVar1;
    memcpy((void *)in_RDI[2],local_18,__n);
    in_RDI[2] = __n + in_RDI[2];
    in_RDI[3] = in_RDI[3] - __n;
    in_RDI[4] = __n + in_RDI[4];
    local_18 = (void *)(__n + (long)local_18);
    local_20 = local_20 - __n;
  } while( true );
}

Assistant:

inline bool AppendNoCheck(const char* ip, size_t len) {
    while (len > 0) {
      if (curr_iov_remaining_ == 0) {
        // This iovec is full. Go to the next one.
        if (curr_iov_ + 1 >= output_iov_end_) {
          return false;
        }
        ++curr_iov_;
        curr_iov_output_ = reinterpret_cast<char*>(curr_iov_->iov_base);
        curr_iov_remaining_ = curr_iov_->iov_len;
      }

      const size_t to_write = std::min(len, curr_iov_remaining_);
      std::memcpy(curr_iov_output_, ip, to_write);
      curr_iov_output_ += to_write;
      curr_iov_remaining_ -= to_write;
      total_written_ += to_write;
      ip += to_write;
      len -= to_write;
    }

    return true;
  }